

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::HttpServerErrorHandler::handleApplicationError
          (HttpServerErrorHandler *this,Exception *exception,
          Maybe<kj::HttpService::Response_&> *response)

{
  int iVar1;
  char *in_RCX;
  long lVar2;
  char *pcVar3;
  StringPtr value;
  Array<char> local_130;
  String errorMessage;
  Own<kj::AsyncOutputStream,_std::nullptr_t> body;
  HttpHeaders headers;
  undefined1 local_88 [8];
  long local_80;
  undefined1 local_78 [8];
  long local_70;
  undefined1 local_68 [8];
  long local_60;
  HttpHeaderTable headerTable;
  
  if (*(int *)((long)&response[4].ptr + 4) != 2) {
    pcVar3 = (((Exception *)in_RCX)->ownFile).content.ptr;
    if (pcVar3 != (char *)0x0) {
      if (kj::_::Debug::minSeverity < 1) {
        in_RCX = "\"threw exception while serving HTTP response\", exception";
        kj::_::Debug::log<char_const(&)[44],kj::Exception&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x206c,INFO,"\"threw exception while serving HTTP response\", exception",
                   (char (*) [44])"threw exception while serving HTTP response",
                   (Exception *)response);
      }
      HttpHeaderTable::HttpHeaderTable(&headerTable);
      HttpHeaders::HttpHeaders(&headers,&headerTable);
      value.content.size_ = 0xb;
      value.content.ptr = "text/plain";
      anon_unknown_36::requireValidHeaderValue(value);
      headers.indexedHeaders.ptr[0xe].content.ptr = "text/plain";
      headers.indexedHeaders.ptr[0xe].content.size_ = 0xb;
      errorMessage.content.disposer = (ArrayDisposer *)0x0;
      errorMessage.content.ptr = (char *)0x0;
      errorMessage.content.size_ = 0;
      body.disposer = (Disposer *)0x0;
      body.ptr = (AsyncOutputStream *)0x0;
      iVar1 = *(int *)((long)&response[4].ptr + 4);
      if (iVar1 == 3) {
        str<char_const(&)[64],kj::Exception&>
                  ((String *)&local_130,
                   (kj *)"ERROR: The server does not implement this operation. Details:\n\n",
                   (char (*) [64])response,(Exception *)in_RCX);
        Array<char>::operator=(&errorMessage.content,&local_130);
        Array<char>::~Array(&local_130);
        local_70 = 0;
        if (errorMessage.content.size_ != 0) {
          local_70 = errorMessage.content.size_ - 1;
        }
        local_78[0] = 1;
        (*(code *)**(undefined8 **)pcVar3)
                  (&local_130,pcVar3,0x1f5,"Not Implemented",0x10,&headers,local_78);
        Own<kj::AsyncOutputStream,_std::nullptr_t>::operator=
                  (&body,(Own<kj::AsyncOutputStream,_std::nullptr_t> *)&local_130);
        Own<kj::AsyncOutputStream,_std::nullptr_t>::dispose
                  ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)&local_130);
      }
      else if (iVar1 == 1) {
        str<char_const(&)[75],kj::Exception&>
                  ((String *)&local_130,
                   (kj *)
                   "ERROR: The server is temporarily unable to handle your request. Details:\n\n",
                   (char (*) [75])response,(Exception *)in_RCX);
        Array<char>::operator=(&errorMessage.content,&local_130);
        Array<char>::~Array(&local_130);
        local_60 = 0;
        if (errorMessage.content.size_ != 0) {
          local_60 = errorMessage.content.size_ - 1;
        }
        local_68[0] = 1;
        (*(code *)**(undefined8 **)pcVar3)
                  (&local_130,pcVar3,0x1f7,"Service Unavailable",0x14,&headers,local_68);
        Own<kj::AsyncOutputStream,_std::nullptr_t>::operator=
                  (&body,(Own<kj::AsyncOutputStream,_std::nullptr_t> *)&local_130);
        Own<kj::AsyncOutputStream,_std::nullptr_t>::dispose
                  ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)&local_130);
      }
      else {
        str<char_const(&)[49],kj::Exception&>
                  ((String *)&local_130,(kj *)"ERROR: The server threw an exception. Details:\n\n",
                   (char (*) [49])response,(Exception *)in_RCX);
        Array<char>::operator=(&errorMessage.content,&local_130);
        Array<char>::~Array(&local_130);
        local_80 = 0;
        if (errorMessage.content.size_ != 0) {
          local_80 = errorMessage.content.size_ - 1;
        }
        local_88[0] = 1;
        (*(code *)**(undefined8 **)pcVar3)
                  (&local_130,pcVar3,500,"Internal Server Error",0x16,&headers,local_88);
        Own<kj::AsyncOutputStream,_std::nullptr_t>::operator=
                  (&body,(Own<kj::AsyncOutputStream,_std::nullptr_t> *)&local_130);
        Own<kj::AsyncOutputStream,_std::nullptr_t>::dispose
                  ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)&local_130);
      }
      pcVar3 = (char *)errorMessage.content.size_;
      if (errorMessage.content.size_ != 0) {
        pcVar3 = errorMessage.content.ptr;
      }
      lVar2 = 0;
      if (errorMessage.content.size_ != 0) {
        lVar2 = errorMessage.content.size_ - 1;
      }
      (**(body.ptr)->_vptr_AsyncOutputStream)(&local_130,body.ptr,pcVar3,lVar2);
      Promise<void>::attach<kj::String,kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
                ((Promise<void> *)this,(String *)&local_130,
                 (Own<kj::AsyncOutputStream,_std::nullptr_t> *)&errorMessage);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_130);
      Own<kj::AsyncOutputStream,_std::nullptr_t>::dispose(&body);
      Array<char>::~Array(&errorMessage.content);
      HttpHeaders::~HttpHeaders(&headers);
      HttpHeaderTable::~HttpHeaderTable(&headerTable);
      return (PromiseBase)(PromiseBase)this;
    }
    if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[64],char_const(&)[35],kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x2087,ERROR,
                 "\"HttpService threw exception after generating a partial response\", \"too late to report error to client\", exception"
                 ,(char (*) [64])"HttpService threw exception after generating a partial response",
                 (char (*) [35])"too late to report error to client",(Exception *)response);
    }
  }
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpServerErrorHandler::handleApplicationError(
    kj::Exception exception, kj::Maybe<kj::HttpService::Response&> response) {
  // Default error handler implementation.

  if (exception.getType() == kj::Exception::Type::DISCONNECTED) {
    // How do we tell an HTTP client that there was a transient network error, and it should
    // try again immediately? There's no HTTP status code for this (503 is meant for "try
    // again later, not now"). Here's an idea: Don't send any response; just close the
    // connection, so that it looks like the connection between the HTTP client and server
    // was dropped. A good client should treat this exactly the way we want.
    //
    // We also bail here to avoid logging the disconnection, which isn't very interesting.
    return kj::READY_NOW;
  }

  KJ_IF_SOME(r, response) {
    KJ_LOG(INFO, "threw exception while serving HTTP response", exception);

    HttpHeaderTable headerTable {};
    HttpHeaders headers(headerTable);
    headers.set(HttpHeaderId::CONTENT_TYPE, "text/plain");

    kj::String errorMessage;
    kj::Own<AsyncOutputStream> body;

    if (exception.getType() == kj::Exception::Type::OVERLOADED) {
      errorMessage = kj::str(
          "ERROR: The server is temporarily unable to handle your request. Details:\n\n", exception);
      body = r.send(503, "Service Unavailable", headers, errorMessage.size());
    } else if (exception.getType() == kj::Exception::Type::UNIMPLEMENTED) {
      errorMessage = kj::str(
          "ERROR: The server does not implement this operation. Details:\n\n", exception);
      body = r.send(501, "Not Implemented", headers, errorMessage.size());
    } else {
      errorMessage = kj::str(
          "ERROR: The server threw an exception. Details:\n\n", exception);
      body = r.send(500, "Internal Server Error", headers, errorMessage.size());
    }

    return body->write(errorMessage.asBytes()).attach(kj::mv(errorMessage), kj::mv(body));
  }

  KJ_LOG(ERROR, "HttpService threw exception after generating a partial response",
                "too late to report error to client", exception);
  return kj::READY_NOW;
}